

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

void __thiscall Type::GenPreParsing(Type *this,Output *out_cc,Env *env)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  Env *in_RDX;
  Output *in_RSI;
  Type *in_RDI;
  Env *in_stack_000000e0;
  Output *in_stack_000000e8;
  Type *in_stack_000000f0;
  ID *in_stack_ffffffffffffffc8;
  Env *this_00;
  
  bVar1 = incremental_input(in_RDI);
  if ((bVar1) &&
     (uVar2 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x10])(), (uVar2 & 1) != 0)) {
    this_00 = in_RDX;
    value_var(in_RDI);
    pcVar3 = Env::LValue(this_00,in_stack_ffffffffffffffc8);
    Output::println(in_RSI,"if ( ! %s )",pcVar3);
    Output::inc_indent(in_RSI);
    Output::println(in_RSI,"{");
    (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x17])(in_RDI,in_RSI,in_RDX);
    Output::println(in_RSI,"}");
    Output::dec_indent(in_RSI);
  }
  else {
    (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x17])(in_RDI,in_RSI,in_RDX);
  }
  bVar1 = buffer_input(in_RDI);
  if (bVar1) {
    GenBufferConfiguration(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  }
  return;
}

Assistant:

void Type::GenPreParsing(Output* out_cc, Env* env)
	{
	if ( incremental_input() && IsPointerType() )
		{
		out_cc->println("if ( ! %s )", env->LValue(value_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		GenNewInstance(out_cc, env);
		out_cc->println("}");
		out_cc->dec_indent();
		}
	else
		GenNewInstance(out_cc, env);

	if ( buffer_input() )
		{
		GenBufferConfiguration(out_cc, env);
		}
	}